

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# oonf_subsystem.c
# Opt level: O1

int oonf_subsystem_init(void)

{
  int iVar1;
  int iVar2;
  oonf_libdata *poVar3;
  
  iVar1 = abuf_init(&_dlopen_data_buffer);
  iVar2 = -1;
  if (iVar1 == 0) {
    if (_plugin_tree_initialized == '\0') {
      avl_init(&oonf_plugin_tree,avl_comp_strcasecmp,false);
      _plugin_tree_initialized = '\x01';
    }
    poVar3 = oonf_log_get_libdata();
    _dlopen_data[2].value = poVar3->sharedlibrary_prefix;
    poVar3 = oonf_log_get_libdata();
    _dlopen_data[3].value = poVar3->sharedlibrary_postfix;
    poVar3 = oonf_log_get_libdata();
    _dlopen_data[4].value = poVar3->version;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int
oonf_subsystem_init(void) {
  if (abuf_init(&_dlopen_data_buffer)) {
    return -1;
  }

  _init_plugin_tree();

  /* load predefined values for dlopen templates */
  _dlopen_data[IDX_DLOPEN_PRE].value = oonf_log_get_libdata()->sharedlibrary_prefix;
  _dlopen_data[IDX_DLOPEN_POST].value = oonf_log_get_libdata()->sharedlibrary_postfix;
  _dlopen_data[IDX_DLOPEN_VER].value = oonf_log_get_libdata()->version;
  return 0;
}